

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

void slang::ast::Lookup::unqualifiedImpl
               (Scope *scope,string_view name,LookupLocation location,
               optional<slang::SourceRange> sourceRange,bitmask<slang::ast::LookupFlags> flags,
               SymbolIndex outOfBlockIndex,LookupResult *result)

{
  string_view name_00;
  string_view arg;
  string_view arg_00;
  string_view lookupName;
  Diagnostic *pDVar1;
  string_view *psVar2;
  bool bVar3;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *this;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*> *ppVar4;
  TypeAliasType *this_00;
  GenericClassDefSymbol *this_01;
  TransparentMemberSymbol *pTVar5;
  MethodPrototypeSymbol *this_02;
  ModportClockingSymbol *pMVar6;
  DeclaredType *this_03;
  size_type sVar7;
  SourceRange *pSVar8;
  ExplicitImportSymbol *pEVar9;
  reference pIVar10;
  PackageSymbol *this_04;
  Symbol *pSVar11;
  Scope *pSVar12;
  SubroutineSymbol *pSVar13;
  ConstraintBlockSymbol *this_05;
  ClassType *pCVar14;
  Type *pTVar15;
  char *pcVar16;
  LookupLocation LVar17;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>::templated_iterator<const_slang::ast::Symbol_*>,_bool>
  pVar18;
  bool local_491;
  byte local_3f1;
  Type *baseClass;
  uint32_t local_368;
  Symbol *local_360;
  Symbol *sym;
  uint32_t local_350;
  Type *local_348;
  uint32_t local_340;
  Symbol *local_338;
  Symbol *sym_1;
  Scope *currScope;
  DiagCode local_31c;
  SourceLocation local_318;
  DiagCode local_30c;
  SourceLocation local_308;
  undefined4 local_2fc;
  uint32_t local_2f8;
  undefined4 uStack_2f4;
  char *pcStack_2f0;
  SourceLocation local_2e8;
  SourceLocation SStack_2e0;
  DiagCode local_2cc;
  Diagnostic *local_2c8;
  Diagnostic *diag_1;
  SourceLocation local_2b8;
  undefined4 local_2ac;
  SourceLocation local_2a8;
  undefined4 local_29c;
  iterator local_298;
  Import *pair;
  iterator __end6;
  iterator __begin6;
  SmallVector<Import,_4UL> *__range6;
  char *pcStack_270;
  SourceLocation local_268;
  SourceLocation SStack_260;
  DiagCode local_254;
  Diagnostic *local_250;
  Diagnostic *diag;
  WildcardImportSymbol *local_240;
  EntryPointer local_238;
  undefined1 local_230;
  EntryPointer local_228;
  undefined1 local_220;
  uint32_t local_218;
  undefined4 uStack_214;
  char *pcStack_210;
  Diagnostic *local_200;
  Symbol *imported;
  PackageSymbol *package;
  uint32_t local_1e8;
  LookupLocation local_1e0;
  WildcardImportSymbol *local_1d0;
  WildcardImportSymbol *import;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::WildcardImportSymbol_*const,_18446744073709551615UL> *__range3;
  undefined1 local_1a0 [8];
  SmallSet<const_slang::ast::Symbol_*,_2UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
  importDedup;
  SmallVector<Import,_4UL> imports;
  span<const_slang::ast::WildcardImportSymbol_*const,_18446744073709551615UL> wildcardImports;
  DeclaredType *declaredType;
  LookupLocation local_d0;
  MethodPrototypeSymbol *local_c0;
  MethodPrototypeSymbol *sub_1;
  SubroutineSymbol *sub;
  ForwardingTypedefSymbol *forward;
  uint32_t local_a0;
  LookupLocation local_98;
  bitmask<slang::ast::LookupFlags> local_88;
  byte local_81;
  const_iterator cStack_80;
  bool locationGood;
  templated_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_78;
  const_iterator it;
  Symbol *symbol;
  SymbolMap *nameMap;
  anon_class_32_4_2e62d3a1 reportRecursiveError;
  Scope *scope_local;
  undefined1 auStack_30 [4];
  bitmask<slang::ast::LookupFlags> flags_local;
  LookupLocation location_local;
  string_view name_local;
  
  _auStack_30 = (Type *)location.scope;
  pcVar16 = name._M_str;
  location_local._8_8_ = name._M_len;
  location_local.scope._0_4_ = location.index;
  reportRecursiveError.sourceRange = (optional<slang::SourceRange> *)result;
  reportRecursiveError.scope = (Scope *)&location_local.index;
  nameMap = (SymbolMap *)&sourceRange;
  reportRecursiveError.result = (LookupResult *)scope;
  reportRecursiveError.name = (string_view *)scope;
  scope_local._4_4_ = flags.m_bits;
  this = &Scope::getNameMap(scope)->
          super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  ;
  it.current = (EntryPointer)0x0;
  local_78.current =
       (EntryPointer)
       ska::detailv3::
       sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
       ::find(this,(basic_string_view<char,_std::char_traits<char>_> *)&location_local.index);
  cStack_80 = ska::detailv3::
              sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
              ::end(this);
  bVar3 = ska::detailv3::operator!=(&local_78,&stack0xffffffffffffff80);
  if (bVar3) {
    ppVar4 = ska::detailv3::
             sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
             ::
             templated_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
             ::operator->(&local_78);
    it.current = (EntryPointer)ppVar4->second;
    local_81 = 1;
    bitmask<slang::ast::LookupFlags>::bitmask(&local_88,AllowDeclaredAfter);
    bVar3 = bitmask<slang::ast::LookupFlags>::has
                      ((bitmask<slang::ast::LookupFlags> *)((long)&scope_local + 4),&local_88);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      LVar17 = LookupLocation::before((Symbol *)it.current);
      forward = (ForwardingTypedefSymbol *)LVar17.scope;
      local_a0 = LVar17.index;
      local_98.scope = (Scope *)forward;
      local_98.index = local_a0;
      local_81 = LookupLocation::operator<(&local_98,(LookupLocation *)auStack_30);
      if (!(bool)local_81) {
        sub = (SubroutineSymbol *)0x0;
        switch(*(undefined4 *)it.current) {
        case 0x14:
          pCVar14 = Symbol::as<slang::ast::ClassType>((Symbol *)it.current);
          sub = (SubroutineSymbol *)ClassType::getFirstForwardDecl(pCVar14);
          break;
        default:
          break;
        case 0x21:
          this_00 = Symbol::as<slang::ast::TypeAliasType>((Symbol *)it.current);
          sub = (SubroutineSymbol *)TypeAliasType::getFirstForwardDecl(this_00);
          break;
        case 0x3e:
          sub_1 = (MethodPrototypeSymbol *)
                  Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)it.current);
          bVar3 = DeclaredType::isEvaluating(&((SubroutineSymbol *)sub_1)->declaredReturnType);
          if (bVar3) {
            unqualifiedImpl::anon_class_32_4_2e62d3a1::operator()
                      ((anon_class_32_4_2e62d3a1 *)&nameMap,(Symbol *)it.current);
            return;
          }
          pTVar15 = SubroutineSymbol::getReturnType((SubroutineSymbol *)sub_1);
          local_81 = Type::isVoid(pTVar15);
          break;
        case 0x41:
          this_01 = Symbol::as<slang::ast::GenericClassDefSymbol>((Symbol *)it.current);
          sub = (SubroutineSymbol *)GenericClassDefSymbol::getFirstForwardDecl(this_01);
          break;
        case 0x42:
          local_c0 = Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)it.current);
          bVar3 = DeclaredType::isEvaluating(&local_c0->declaredReturnType);
          if (bVar3) {
            unqualifiedImpl::anon_class_32_4_2e62d3a1::operator()
                      ((anon_class_32_4_2e62d3a1 *)&nameMap,(Symbol *)it.current);
            return;
          }
          pTVar15 = MethodPrototypeSymbol::getReturnType(local_c0);
          local_81 = Type::isVoid(pTVar15);
          break;
        case 0x4d:
        case 0x4e:
          local_81 = 1;
        }
        if (sub != (SubroutineSymbol *)0x0) {
          LVar17 = LookupLocation::before(&sub->super_Symbol);
          local_d0.scope = LVar17.scope;
          local_d0.index = LVar17.index;
          local_81 = LookupLocation::operator<(&local_d0,(LookupLocation *)auStack_30);
          result->fromForwardTypedef = true;
        }
      }
    }
    if ((local_81 & 1) != 0) {
      while (*(int *)it.current == 4) {
        pTVar5 = Symbol::as<slang::ast::TransparentMemberSymbol>((Symbol *)it.current);
        it.current = (EntryPointer)pTVar5->wrapped;
      }
      switch(*(undefined4 *)it.current) {
      case 0x23:
        break;
      default:
        result->found = (Symbol *)it.current;
        break;
      case 0x2c:
        pMVar6 = Symbol::as<slang::ast::ModportClockingSymbol>((Symbol *)it.current);
        result->found = pMVar6->target;
        break;
      case 0x31:
        pEVar9 = Symbol::as<slang::ast::ExplicitImportSymbol>((Symbol *)it.current);
        pSVar11 = ExplicitImportSymbol::importedSymbol(pEVar9);
        result->found = pSVar11;
        result->wasImported = true;
        break;
      case 0x42:
        this_02 = Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)it.current);
        pSVar13 = MethodPrototypeSymbol::getSubroutine(this_02);
        result->found = &pSVar13->super_Symbol;
      }
      if (result->found == (Symbol *)0x0) {
        return;
      }
      this_03 = Symbol::getDeclaredType(result->found);
      if (this_03 == (DeclaredType *)0x0) {
        return;
      }
      bVar3 = DeclaredType::isEvaluating(this_03);
      if (!bVar3) {
        return;
      }
      unqualifiedImpl::anon_class_32_4_2e62d3a1::operator()
                ((anon_class_32_4_2e62d3a1 *)&nameMap,result->found);
      return;
    }
  }
  join_0x00000010_0x00000000_ = Scope::getWildcardImports((Scope *)reportRecursiveError.name);
  bVar3 = nonstd::span_lite::
          span<const_slang::ast::WildcardImportSymbol_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::WildcardImportSymbol_*const,_18446744073709551615UL> *)
                     (imports.stackBase + 0x28));
  if (bVar3) goto LAB_0041e164;
  SmallVector<Import,_4UL>::SmallVector
            ((SmallVector<Import,_4UL> *)
             &importDedup.
              super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
              .
              super_sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
              .num_elements);
  SmallSet<const_slang::ast::Symbol_*,_2UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
  ::SmallSet((SmallSet<const_slang::ast::Symbol_*,_2UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
              *)local_1a0);
  __begin3 = (iterator)(imports.stackBase + 0x28);
  __end3 = nonstd::span_lite::
           span<const_slang::ast::WildcardImportSymbol_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::WildcardImportSymbol_*const,_18446744073709551615UL> *
                      )__begin3);
  import = (WildcardImportSymbol *)
           nonstd::span_lite::
           span<const_slang::ast::WildcardImportSymbol_*const,_18446744073709551615UL>::end
                     ((span<const_slang::ast::WildcardImportSymbol_*const,_18446744073709551615UL> *
                      )__begin3);
  for (; (WildcardImportSymbol *)__end3 != import; __end3 = __end3 + 1) {
    local_1d0 = *__end3;
    LVar17 = LookupLocation::after(&local_1d0->super_Symbol);
    package = (PackageSymbol *)LVar17.scope;
    local_1e8 = LVar17.index;
    local_1e0.scope = (Scope *)package;
    local_1e0.index = local_1e8;
    bVar3 = LookupLocation::operator<((LookupLocation *)auStack_30,&local_1e0);
    if (bVar3) break;
    imported = &WildcardImportSymbol::getPackage(local_1d0)->super_Symbol;
    if ((PackageSymbol *)imported == (PackageSymbol *)0x0) {
      result->suppressUndeclared = true;
    }
    else {
      local_218 = location_local.index;
      uStack_214 = location_local._12_4_;
      lookupName._M_str = pcVar16;
      lookupName._M_len = location_local._8_8_;
      pcStack_210 = pcVar16;
      local_200 = (Diagnostic *)PackageSymbol::findForImport((PackageSymbol *)imported,lookupName);
      local_3f1 = 0;
      if (local_200 != (Diagnostic *)0x0) {
        pVar18 = ska::
                 flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                 ::emplace((flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                            *)&importDedup.
                               super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>
                               .ptr,(key_type *)&local_200);
        local_238 = (EntryPointer)pVar18.first.current;
        local_3f1 = pVar18.second;
        local_230 = local_3f1;
        local_228 = local_238;
        local_220 = local_3f1;
      }
      if ((local_3f1 & 1) != 0) {
        diag = local_200;
        local_240 = local_1d0;
        SmallVectorBase<slang::ast::Lookup::unqualifiedImpl(slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>,slang::ast::LookupLocation,std::optional<slang::SourceRange>,slang::bitmask<slang::ast::LookupFlags>,slang::ast::SymbolIndex,slang::ast::LookupResult&)::Import>
        ::
        emplace_back<slang::ast::Lookup::unqualifiedImpl(slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>,slang::ast::LookupLocation,std::optional<slang::SourceRange>,slang::bitmask<slang::ast::LookupFlags>,slang::ast::SymbolIndex,slang::ast::LookupResult&)::Import>
                  ((SmallVectorBase<slang::ast::Lookup::unqualifiedImpl(slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>,slang::ast::LookupLocation,std::optional<slang::SourceRange>,slang::bitmask<slang::ast::LookupFlags>,slang::ast::SymbolIndex,slang::ast::LookupResult&)::Import>
                    *)&importDedup.
                       super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                       .
                       super_sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                       .num_elements,(Import *)&diag);
      }
    }
  }
  bVar3 = SmallVectorBase<Import>::empty
                    ((SmallVectorBase<Import> *)
                     &importDedup.
                      super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                      .
                      super_sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                      .num_elements);
  if (bVar3) {
    diag_1._4_4_ = 0;
  }
  else {
    sVar7 = SmallVectorBase<Import>::size
                      ((SmallVectorBase<Import> *)
                       &importDedup.
                        super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                        .
                        super_sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                        .num_elements);
    if (sVar7 < 2) {
      if ((it.current != (EntryPointer)0x0) &&
         (bVar3 = std::optional::operator_cast_to_bool((optional *)&sourceRange), bVar3)) {
        if (*(int *)it.current == 0x31) {
          pEVar9 = Symbol::as<slang::ast::ExplicitImportSymbol>((Symbol *)it.current);
          pSVar11 = ExplicitImportSymbol::importedSymbol(pEVar9);
          pIVar10 = SmallVectorBase<Import>::operator[]
                              ((SmallVectorBase<Import> *)
                               &importDedup.
                                super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                                .
                                super_sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                                .num_elements,0);
          if (pSVar11 == pIVar10->imported) goto LAB_0041e049;
        }
        psVar2 = reportRecursiveError.name;
        local_2cc.subsystem = Lookup;
        local_2cc.code = 0xb;
        pSVar8 = std::optional<slang::SourceRange>::operator*(&sourceRange);
        local_2e8 = pSVar8->startLoc;
        SStack_2e0 = pSVar8->endLoc;
        local_2c8 = LookupResult::addDiag(result,(Scope *)psVar2,local_2cc,*pSVar8);
        local_2f8 = location_local.index;
        uStack_2f4 = location_local._12_4_;
        arg._M_str = pcVar16;
        arg._M_len = location_local._8_8_;
        pcStack_2f0 = pcVar16;
        Diagnostic::operator<<(local_2c8,arg);
        local_2fc = 0x40001;
        local_308 = (SourceLocation)((it.current)->field_1).value.second;
        Diagnostic::addNote(local_2c8,(DiagCode)0x40001,local_308);
        pDVar1 = local_2c8;
        local_30c.subsystem = Lookup;
        local_30c.code = 0x39;
        pIVar10 = SmallVectorBase<Import>::operator[]
                            ((SmallVectorBase<Import> *)
                             &importDedup.
                              super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                              .
                              super_sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                              .num_elements,0);
        local_318 = (pIVar10->import->super_Symbol).location;
        Diagnostic::addNote(pDVar1,local_30c,local_318);
        pDVar1 = local_2c8;
        local_31c.subsystem = General;
        local_31c.code = 4;
        pIVar10 = SmallVectorBase<Import>::operator[]
                            ((SmallVectorBase<Import> *)
                             &importDedup.
                              super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                              .
                              super_sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                              .num_elements,0);
        currScope = *(Scope **)&pIVar10->imported->location;
        Diagnostic::addNote(pDVar1,local_31c,(SourceLocation)currScope);
      }
LAB_0041e049:
      result->wasImported = true;
      pIVar10 = SmallVectorBase<Import>::operator[]
                          ((SmallVectorBase<Import> *)
                           &importDedup.
                            super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                            .
                            super_sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                            .num_elements,0);
      result->found = pIVar10->imported;
      sym_1 = (Symbol *)reportRecursiveError.name;
      do {
        local_338 = Scope::asSymbol((Scope *)sym_1);
        if (local_338->kind == Package) {
          this_04 = Symbol::as<slang::ast::PackageSymbol>(local_338);
          PackageSymbol::noteImport(this_04,result->found);
          break;
        }
        sym_1 = (Symbol *)Symbol::getParentScope(local_338);
      } while (sym_1 != (Symbol *)0x0);
      diag_1._4_4_ = 1;
    }
    else {
      bVar3 = std::optional::operator_cast_to_bool((optional *)&sourceRange);
      psVar2 = reportRecursiveError.name;
      if (bVar3) {
        local_254.subsystem = Lookup;
        local_254.code = 0;
        pSVar8 = std::optional<slang::SourceRange>::operator*(&sourceRange);
        local_268 = pSVar8->startLoc;
        SStack_260 = pSVar8->endLoc;
        local_250 = LookupResult::addDiag(result,(Scope *)psVar2,local_254,*pSVar8);
        __range6 = (SmallVector<Import,_4UL> *)location_local._8_8_;
        arg_00._M_str = pcVar16;
        arg_00._M_len = location_local._8_8_;
        pcStack_270 = pcVar16;
        Diagnostic::operator<<(local_250,arg_00);
        __begin6 = (iterator)
                   &importDedup.
                    super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                    .
                    super_sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                    .num_elements;
        __end6 = SmallVectorBase<Import>::begin((SmallVectorBase<Import> *)__begin6);
        pair = SmallVectorBase<Import>::end((SmallVectorBase<Import> *)__begin6);
        for (; __end6 != pair; __end6 = __end6 + 1) {
          local_298 = __end6;
          local_29c = 0x39000a;
          local_2a8 = (__end6->import->super_Symbol).location;
          Diagnostic::addNote(local_250,(DiagCode)0x39000a,local_2a8);
          local_2ac = 0x40001;
          local_2b8 = local_298->imported->location;
          Diagnostic::addNote(local_250,(DiagCode)0x40001,local_2b8);
        }
      }
      diag_1._4_4_ = 1;
    }
  }
  SmallSet<const_slang::ast::Symbol_*,_2UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
  ::~SmallSet((SmallSet<const_slang::ast::Symbol_*,_2UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
               *)local_1a0);
  SmallVector<Import,_4UL>::~SmallVector
            ((SmallVector<Import,_4UL> *)
             &importDedup.
              super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
              .
              super_sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
              .num_elements);
  if (diag_1._4_4_ != 0) {
    return;
  }
LAB_0041e164:
  pSVar11 = Scope::asSymbol((Scope *)reportRecursiveError.name);
  LVar17 = LookupLocation::after(pSVar11);
  sym = (Symbol *)LVar17.scope;
  local_350 = LVar17.index;
  local_348 = (Type *)sym;
  local_340 = local_350;
  _auStack_30 = (Type *)sym;
  location_local.scope._0_4_ = local_350;
  pSVar12 = LookupLocation::getScope((LookupLocation *)auStack_30);
  if (pSVar12 != (Scope *)0x0) {
    local_360 = Scope::asSymbol((Scope *)reportRecursiveError.name);
    if (local_360->kind == Subroutine) {
      pSVar13 = Symbol::as<slang::ast::SubroutineSymbol>(local_360);
      outOfBlockIndex = pSVar13->outOfBlockIndex;
    }
    else if (local_360->kind == ConstraintBlock) {
      this_05 = Symbol::as<slang::ast::ConstraintBlockSymbol>(local_360);
      outOfBlockIndex = ConstraintBlockSymbol::getOutOfBlockIndex(this_05);
    }
    else if (outOfBlockIndex == 0) {
      if (local_360->kind == ClassType) {
        pCVar14 = Symbol::as<slang::ast::ClassType>(local_360);
        pTVar15 = ClassType::getBaseClass(pCVar14);
        local_491 = false;
        if (pTVar15 != (Type *)0x0) {
          local_491 = Type::isError(pTVar15);
        }
        result->suppressUndeclared = (result->suppressUndeclared & 1U) != 0 || local_491 != false;
      }
    }
    else {
      pSVar12 = LookupLocation::getScope((LookupLocation *)auStack_30);
      LookupLocation::LookupLocation((LookupLocation *)&baseClass,pSVar12,outOfBlockIndex);
      _auStack_30 = baseClass;
      location_local.scope._0_4_ = local_368;
      outOfBlockIndex = 0;
    }
    pSVar12 = LookupLocation::getScope((LookupLocation *)auStack_30);
    name_00._M_str = pcVar16;
    name_00._M_len = location_local._8_8_;
    LVar17.index = (uint32_t)location_local.scope;
    LVar17.scope = (Scope *)_auStack_30;
    LVar17._12_4_ = 0;
    unqualifiedImpl(pSVar12,name_00,LVar17,sourceRange,scope_local._4_4_,outOfBlockIndex,result);
  }
  return;
}

Assistant:

void Lookup::unqualifiedImpl(const Scope& scope, string_view name, LookupLocation location,
                             std::optional<SourceRange> sourceRange, bitmask<LookupFlags> flags,
                             SymbolIndex outOfBlockIndex, LookupResult& result) {
    auto reportRecursiveError = [&](const Symbol& symbol) {
        if (sourceRange) {
            auto& diag = result.addDiag(scope, diag::RecursiveDefinition, *sourceRange);
            diag << name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
        }
        result.found = nullptr;
    };

    // Try a simple name lookup to see if we find anything.
    auto& nameMap = scope.getNameMap();
    const Symbol* symbol = nullptr;
    if (auto it = nameMap.find(name); it != nameMap.end()) {
        // If the lookup is for a local name, check that we can access the symbol (it must be
        // declared before use). Callables and block names can be referenced anywhere in the
        // scope, so the location doesn't matter for them.
        symbol = it->second;
        bool locationGood = true;
        if (!flags.has(LookupFlags::AllowDeclaredAfter)) {
            locationGood = LookupLocation::before(*symbol) < location;
            if (!locationGood) {
                // A type alias can have forward definitions, so check those locations as well.
                // The forward decls form a linked list that are always ordered by location,
                // so we only need to check the first one.
                const ForwardingTypedefSymbol* forward = nullptr;
                switch (symbol->kind) {
                    case SymbolKind::TypeAlias:
                        forward = symbol->as<TypeAliasType>().getFirstForwardDecl();
                        break;
                    case SymbolKind::ClassType:
                        forward = symbol->as<ClassType>().getFirstForwardDecl();
                        break;
                    case SymbolKind::GenericClassDef:
                        forward = symbol->as<GenericClassDefSymbol>().getFirstForwardDecl();
                        break;
                    case SymbolKind::Subroutine: {
                        // Subroutines can be referenced before they are declared if they
                        // are tasks or return void (tasks are always set to have a void
                        // return type internally so we only need one check here).
                        //
                        // It's important to check that we're not in the middle of evaluating
                        // the return type before we try to access that return type or
                        // we'll hard fail.
                        auto& sub = symbol->as<SubroutineSymbol>();
                        if (sub.declaredReturnType.isEvaluating()) {
                            reportRecursiveError(*symbol);
                            return;
                        }

                        locationGood = sub.getReturnType().isVoid();
                        break;
                    }
                    case SymbolKind::MethodPrototype: {
                        // Same as above.
                        auto& sub = symbol->as<MethodPrototypeSymbol>();
                        if (sub.declaredReturnType.isEvaluating()) {
                            reportRecursiveError(*symbol);
                            return;
                        }

                        locationGood = sub.getReturnType().isVoid();
                        break;
                    }
                    case SymbolKind::Sequence:
                    case SymbolKind::Property:
                        // Sequences and properties can always be referenced before declaration.
                        locationGood = true;
                        break;
                    default:
                        break;
                }

                if (forward) {
                    locationGood = LookupLocation::before(*forward) < location;
                    result.fromForwardTypedef = true;
                }
            }
        }

        if (locationGood) {
            // Unwrap the symbol if it's hidden behind an import or hoisted enum member.
            while (symbol->kind == SymbolKind::TransparentMember)
                symbol = &symbol->as<TransparentMemberSymbol>().wrapped;

            switch (symbol->kind) {
                case SymbolKind::ExplicitImport:
                    result.found = symbol->as<ExplicitImportSymbol>().importedSymbol();
                    result.wasImported = true;
                    break;
                case SymbolKind::ForwardingTypedef:
                    // If we find a forwarding typedef, the actual typedef was never defined.
                    // Just ignore it, we'll issue a better error later.
                    break;
                case SymbolKind::MethodPrototype:
                    // Looking up a prototype should always forward on to the actual method.
                    result.found = symbol->as<MethodPrototypeSymbol>().getSubroutine();
                    break;
                case SymbolKind::ModportClocking:
                    result.found = symbol->as<ModportClockingSymbol>().target;
                    break;
                default:
                    result.found = symbol;
                    break;
            }

            // We have a fully resolved and valid symbol. Before we return back to the caller,
            // make sure that the symbol we're returning isn't in the process of having its type
            // evaluated. This can only happen with a mutually recursive definition of something
            // like a parameter and a function, so detect and report the error here to avoid a
            // stack overflow.
            if (result.found) {
                auto declaredType = result.found->getDeclaredType();
                if (declaredType && declaredType->isEvaluating())
                    reportRecursiveError(*result.found);
            }

            return;
        }
    }

    // Look through any wildcard imports prior to the lookup point and see if their packages
    // contain the name we're looking for.
    auto wildcardImports = scope.getWildcardImports();
    if (!wildcardImports.empty()) {
        struct Import {
            const Symbol* imported;
            const WildcardImportSymbol* import;
        };
        SmallVector<Import, 4> imports;
        SmallSet<const Symbol*, 2> importDedup;

        for (auto import : wildcardImports) {
            if (location < LookupLocation::after(*import))
                break;

            auto package = import->getPackage();
            if (!package) {
                result.suppressUndeclared = true;
                continue;
            }

            const Symbol* imported = package->findForImport(name);
            if (imported && importDedup.emplace(imported).second)
                imports.emplace_back(Import{imported, import});
        }

        if (!imports.empty()) {
            if (imports.size() > 1) {
                if (sourceRange) {
                    auto& diag = result.addDiag(scope, diag::AmbiguousWildcardImport, *sourceRange);
                    diag << name;
                    for (const auto& pair : imports) {
                        diag.addNote(diag::NoteImportedFrom, pair.import->location);
                        diag.addNote(diag::NoteDeclarationHere, pair.imported->location);
                    }
                }
                return;
            }

            if (symbol && sourceRange) {
                // The existing symbol might be an import for the thing we just imported
                // via wildcard, which is fine so don't error for that case.
                if (symbol->kind != SymbolKind::ExplicitImport ||
                    symbol->as<ExplicitImportSymbol>().importedSymbol() != imports[0].imported) {

                    auto& diag = result.addDiag(scope, diag::ImportNameCollision, *sourceRange);
                    diag << name;
                    diag.addNote(diag::NoteDeclarationHere, symbol->location);
                    diag.addNote(diag::NoteImportedFrom, imports[0].import->location);
                    diag.addNote(diag::NoteDeclarationHere, imports[0].imported->location);
                }
            }

            result.wasImported = true;
            result.found = imports[0].imported;

            // If we are doing this lookup from a scope that is within a package declaration
            // we should note that fact so that it can later be exported if desired.
            auto currScope = &scope;
            do {
                auto& sym = currScope->asSymbol();
                if (sym.kind == SymbolKind::Package) {
                    sym.as<PackageSymbol>().noteImport(*result.found);
                    break;
                }

                currScope = sym.getParentScope();
            } while (currScope);

            return;
        }
    }

    // Continue up the scope chain via our parent.
    location = LookupLocation::after(scope.asSymbol());
    if (!location.getScope())
        return;

    // If this scope was an out-of-block subroutine, tell the next recursive call about it.
    // Otherwise, if our previous call was for such a situation and we didn't find the symbol
    // in this class scope, we need to use the subroutine's out-of-block lookup location
    // instead in order to properly handle cases like:
    //   class C;
    //     extern function int foo;
    //   endclass
    //   localparam int k = ...;
    //   function int C::foo;
    //     return k;
    //   endfunction
    auto& sym = scope.asSymbol();
    if (sym.kind == SymbolKind::Subroutine) {
        outOfBlockIndex = sym.as<SubroutineSymbol>().outOfBlockIndex;
    }
    else if (sym.kind == SymbolKind::ConstraintBlock) {
        outOfBlockIndex = sym.as<ConstraintBlockSymbol>().getOutOfBlockIndex();
    }
    else if (uint32_t(outOfBlockIndex) != 0) {
        location = LookupLocation(location.getScope(), uint32_t(outOfBlockIndex));
        outOfBlockIndex = SymbolIndex(0);
    }
    else if (sym.kind == SymbolKind::ClassType) {
        // Suppress errors when we fail to find a symbol inside a class that
        // had a problem resolving its base class, since the symbol may be
        // expected to be defined in the base.
        auto baseClass = sym.as<ClassType>().getBaseClass();
        result.suppressUndeclared |= baseClass && baseClass->isError();
    }

    return unqualifiedImpl(*location.getScope(), name, location, sourceRange, flags,
                           outOfBlockIndex, result);
}